

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  CharPtr __dest;
  long lVar3;
  byte *pbVar4;
  CharPtr pcVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ptrdiff_t _Num;
  undefined4 local_4c;
  long local_48;
  char *local_40;
  size_t local_38;
  
  uVar1 = spec._20_4_;
  uVar11 = (ulong)(uint)value;
  local_4c = 0;
  if (value < 0) {
    local_4c = 0x2d;
    uVar11 = (ulong)(uint)-value;
LAB_00136444:
    uVar12 = 1;
  }
  else {
    uVar12 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar7 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar7 = 0x20;
      }
      local_4c = (uint)bVar7;
      goto LAB_00136444;
    }
  }
  uVar13 = (uint)uVar11;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00136768;
      if (spec.type_ == 'B') {
LAB_00136687:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar6 = (ulong)uVar12;
          *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
          uVar12 = uVar12 | 2;
          *(char *)((long)&local_4c + uVar6 + 1) = spec.type_;
        }
        uVar13 = 0;
        uVar6 = uVar11;
        do {
          uVar13 = uVar13 + 1;
          uVar14 = (uint)uVar6;
          uVar6 = uVar6 >> 1;
        } while (1 < uVar14);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar13,&spec,(char *)&local_4c,uVar12);
        do {
          uVar12 = (uint)uVar11;
          *pbVar4 = (byte)uVar11 & 1 | 0x30;
          pbVar4 = pbVar4 + -1;
          uVar11 = uVar11 >> 1;
        } while (1 < uVar12);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_001366f3;
      if (spec.type_ == 'b') goto LAB_00136687;
    }
code_r0x00136885:
    internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
      }
      uVar13 = 0;
      uVar6 = uVar11;
      do {
        uVar13 = uVar13 + 1;
        uVar14 = (uint)uVar6;
        uVar6 = uVar6 >> 3;
      } while (7 < uVar14);
      pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar13,&spec,(char *)&local_4c,uVar12);
      do {
        uVar12 = (uint)uVar11;
        *pbVar4 = (byte)uVar11 & 7 | 0x30;
        pbVar4 = pbVar4 + -1;
        uVar11 = uVar11 >> 3;
      } while (7 < uVar12);
      return;
    }
    if (spec.type_ == 'x') {
LAB_001366f3:
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar12;
        *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
        uVar12 = uVar12 | 2;
        *(char *)((long)&local_4c + uVar6 + 1) = spec.type_;
      }
      uVar13 = 0;
      uVar6 = uVar11;
      do {
        uVar13 = uVar13 + 1;
        uVar14 = (uint)uVar6;
        uVar6 = uVar6 >> 4;
      } while (0xf < uVar14);
      pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar13,&spec,(char *)&local_4c,uVar12);
      pcVar8 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar8 = "0123456789abcdef";
      }
      do {
        uVar12 = (uint)uVar11;
        *pcVar5 = pcVar8[uVar12 & 0xf];
        pcVar5 = pcVar5 + -1;
        uVar11 = uVar11 >> 4;
      } while (0xf < uVar12);
      return;
    }
    goto code_r0x00136885;
  }
  if (spec.type_ == 'd') {
LAB_00136768:
    uVar14 = 0x1f;
    if ((uVar13 | 1) != 0) {
      for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    uVar14 = (uVar14 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar14 - (uVar13 < internal::BasicData<void>::POWERS_OF_10_32[uVar14])
                             ) + 1,&spec,(char *)&local_4c,uVar12);
    pcVar5 = pcVar5 + 1;
    if (99 < uVar13) {
      do {
        uVar12 = (uint)uVar11;
        uVar13 = (uint)(uVar11 / 100);
        uVar11 = uVar11 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar12 + (int)uVar11 * -100) * 2);
        pcVar5 = pcVar5 + -2;
      } while (9999 < uVar12);
    }
    if (uVar13 < 10) {
      bVar7 = (byte)uVar13 | 0x30;
      lVar9 = -1;
    }
    else {
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [((ulong)uVar13 * 2 & 0xffffffff) + 1];
      bVar7 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [(ulong)uVar13 * 2];
      lVar9 = -2;
    }
    pcVar5[lVar9] = bVar7;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00136885;
  uVar14 = 0x1f;
  if ((uVar13 | 1) != 0) {
    for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar14 = (uVar14 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  plVar2 = localeconv();
  local_40 = plVar2->thousands_sep;
  __n = strlen(local_40);
  uVar14 = uVar14 - (uVar13 < internal::BasicData<void>::POWERS_OF_10_32[uVar14]);
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar14 + (int)__n * (uVar14 / 3) + 1,&spec,(char *)&local_4c,uVar12);
  pcVar5 = __dest + 1;
  if (uVar13 < 100) {
    if (9 < uVar13) {
      uVar11 = (ulong)(uVar13 * 2);
      *__dest = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [uVar11 + 1];
      goto LAB_001368bb;
    }
  }
  else {
    lVar9 = -__n;
    uVar12 = 0;
    local_48 = lVar9;
    local_38 = __n;
    do {
      uVar14 = uVar12;
      uVar6 = uVar11;
      uVar13 = (uint)uVar6;
      uVar11 = uVar6 / 100;
      iVar10 = (int)(uVar6 / 100);
      uVar15 = (ulong)((uVar13 + iVar10 * -100) * 2);
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar15 + 1];
      if ((uVar14 | 1) * -0x55555555 < 0x55555556) {
        pcVar5 = pcVar5 + lVar9 + -1;
        if (__n == 0) {
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar15];
          lVar3 = 0;
          if ((uVar14 + 2) * -0x55555555 < 0x55555556) {
            lVar3 = lVar9;
          }
          pcVar5 = pcVar5 + lVar3 + -1;
        }
        else {
          memmove(pcVar5,local_40,__n);
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar15];
          pcVar5 = pcVar5 + -1;
          lVar9 = local_48;
          __n = local_38;
          if ((uVar14 + 2) * -0x55555555 < 0x55555556) {
            pcVar5 = pcVar5 + local_48;
            goto LAB_00136603;
          }
        }
      }
      else {
        pcVar5[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar15];
        pcVar5 = pcVar5 + -2;
        if (((uVar14 + 2) * -0x55555555 < 0x55555556) && (pcVar5 = pcVar5 + lVar9, __n != 0)) {
LAB_00136603:
          memmove(pcVar5,local_40,local_38);
          lVar9 = local_48;
          __n = local_38;
        }
      }
      uVar12 = uVar14 + 2;
    } while (9999 < uVar13);
    if (999 < uVar13) {
      uVar11 = (ulong)(uint)(iVar10 + (int)(uVar6 / 100));
      __dest = pcVar5 + -1;
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar11 + 1];
      if ((uVar14 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,local_40,__n);
      }
LAB_001368bb:
      bVar7 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar11];
      pcVar5 = __dest;
      goto LAB_001368c7;
    }
  }
  bVar7 = (byte)uVar11 | 0x30;
LAB_001368c7:
  pcVar5[-1] = bVar7;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}